

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_ObjRecognizeExor(Gia_Obj_t *pObj,Gia_Obj_t **ppFan0,Gia_Obj_t **ppFan1)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *p1;
  Gia_Obj_t *p0;
  Gia_Obj_t **ppFan1_local;
  Gia_Obj_t **ppFan0_local;
  Gia_Obj_t *pObj_local;
  
  iVar1 = Gia_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x3ad,"int Gia_ObjRecognizeExor(Gia_Obj_t *, Gia_Obj_t **, Gia_Obj_t **)");
  }
  iVar1 = Gia_ObjIsAnd(pObj);
  if ((iVar1 == 0) || (iVar1 = Gia_ObjIsBuf(pObj), iVar1 != 0)) {
    return 0;
  }
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x3b0,"int Gia_ObjRecognizeExor(Gia_Obj_t *, Gia_Obj_t **, Gia_Obj_t **)");
  }
  pGVar3 = Gia_ObjChild0(pObj);
  pGVar4 = Gia_ObjChild1(pObj);
  iVar1 = Gia_IsComplement(pGVar3);
  if ((iVar1 != 0) && (iVar1 = Gia_IsComplement(pGVar4), iVar1 != 0)) {
    pGVar3 = Gia_Regular(pGVar3);
    pGVar4 = Gia_Regular(pGVar4);
    iVar1 = Gia_ObjIsAnd(pGVar3);
    if ((iVar1 != 0) && (iVar1 = Gia_ObjIsAnd(pGVar4), iVar1 != 0)) {
      pGVar5 = Gia_ObjFanin0(pGVar3);
      pGVar6 = Gia_ObjFanin0(pGVar4);
      if (pGVar5 == pGVar6) {
        pGVar5 = Gia_ObjFanin1(pGVar3);
        pGVar6 = Gia_ObjFanin1(pGVar4);
        if (pGVar5 == pGVar6) {
          iVar1 = Gia_ObjFaninC0(pGVar3);
          iVar2 = Gia_ObjFaninC0(pGVar4);
          if (iVar1 != iVar2) {
            iVar1 = Gia_ObjFaninC1(pGVar3);
            iVar2 = Gia_ObjFaninC1(pGVar4);
            if (iVar1 != iVar2) {
              if (ppFan0 != (Gia_Obj_t **)0x0) {
                pGVar4 = Gia_ObjChild0(pGVar3);
                *ppFan0 = pGVar4;
              }
              if (ppFan1 != (Gia_Obj_t **)0x0) {
                pGVar3 = Gia_ObjChild1(pGVar3);
                *ppFan1 = pGVar3;
              }
              return 1;
            }
          }
          return 0;
        }
      }
      return 0;
    }
    return 0;
  }
  return 0;
}

Assistant:

int Gia_ObjRecognizeExor( Gia_Obj_t * pObj, Gia_Obj_t ** ppFan0, Gia_Obj_t ** ppFan1 )
{
    Gia_Obj_t * p0, * p1;
    assert( !Gia_IsComplement(pObj) );
    if ( !Gia_ObjIsAnd(pObj) || Gia_ObjIsBuf(pObj) )
        return 0;
    assert( Gia_ObjIsAnd(pObj) );
    p0 = Gia_ObjChild0(pObj);
    p1 = Gia_ObjChild1(pObj);
    if ( !Gia_IsComplement(p0) || !Gia_IsComplement(p1) )
        return 0;
    p0 = Gia_Regular(p0);
    p1 = Gia_Regular(p1);
    if ( !Gia_ObjIsAnd(p0) || !Gia_ObjIsAnd(p1) )
        return 0;
    if ( Gia_ObjFanin0(p0) != Gia_ObjFanin0(p1) || Gia_ObjFanin1(p0) != Gia_ObjFanin1(p1) )
        return 0;
    if ( Gia_ObjFaninC0(p0) == Gia_ObjFaninC0(p1) || Gia_ObjFaninC1(p0) == Gia_ObjFaninC1(p1) )
        return 0;
    if ( ppFan0 ) *ppFan0 = Gia_ObjChild0(p0);
    if ( ppFan1 ) *ppFan1 = Gia_ObjChild1(p0);
    return 1;
}